

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestBase.cpp
# Opt level: O3

void Tests::Cleanup(void)

{
  undefined8 *puVar1;
  ulong uVar2;
  
  if (expressionEvaluionFails != 0) {
    puVar1 = &expressionEvaluionFailInfo;
    uVar2 = 0;
    do {
      free((void *)*puVar1);
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + 2;
    } while (uVar2 < expressionEvaluionFails);
  }
  expressionEvaluionFails = 0;
  if (instructionEvaluionFails != 0) {
    puVar1 = &instructionEvaluionFailInfo;
    uVar2 = 0;
    do {
      free((void *)*puVar1);
      uVar2 = uVar2 + 1;
      puVar1 = puVar1 + 2;
    } while (uVar2 < instructionEvaluionFails);
  }
  instructionEvaluionFails = 0;
  return;
}

Assistant:

void Tests::Cleanup()
{
	for(unsigned i = 0; i < expressionEvaluionFails; i++)
		free(expressionEvaluionFailInfo[i].reason);
	expressionEvaluionFails = 0;

	for(unsigned i = 0; i < instructionEvaluionFails; i++)
		free(instructionEvaluionFailInfo[i].reason);
	instructionEvaluionFails = 0;
}